

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QXmlStreamAttribute>::emplace<QXmlStreamAttribute>
          (QMovableArrayOps<QXmlStreamAttribute> *this,qsizetype i,QXmlStreamAttribute *args)

{
  QXmlStreamAttribute *pQVar1;
  QXmlStreamAttribute **ppQVar2;
  qsizetype *pqVar3;
  long lVar4;
  Data *pDVar5;
  QXmlStreamAttribute *pQVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  Data *pDVar10;
  char16_t *pcVar11;
  qsizetype qVar12;
  Data *pDVar13;
  char16_t *pcVar14;
  qsizetype qVar15;
  Data *pDVar16;
  char16_t *pcVar17;
  qsizetype qVar18;
  byte bVar19;
  long in_FS_OFFSET;
  bool bVar20;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
           super_QArrayDataPointer<QXmlStreamAttribute>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0039e709:
    pDVar7 = (args->m_name).m_string.d;
    (args->m_name).m_string.d = (Data *)0x0;
    pcVar8 = (args->m_name).m_string.ptr;
    (args->m_name).m_string.ptr = (char16_t *)0x0;
    qVar9 = (args->m_name).m_string.size;
    (args->m_name).m_string.size = 0;
    pDVar10 = (args->m_namespaceUri).m_string.d;
    (args->m_namespaceUri).m_string.d = (Data *)0x0;
    pcVar11 = (args->m_namespaceUri).m_string.ptr;
    (args->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
    qVar12 = (args->m_namespaceUri).m_string.size;
    (args->m_namespaceUri).m_string.size = 0;
    pDVar13 = (args->m_qualifiedName).m_string.d;
    (args->m_qualifiedName).m_string.d = (Data *)0x0;
    pcVar14 = (args->m_qualifiedName).m_string.ptr;
    (args->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
    qVar15 = (args->m_qualifiedName).m_string.size;
    (args->m_qualifiedName).m_string.size = 0;
    pDVar16 = (args->m_value).m_string.d;
    (args->m_value).m_string.d = (Data *)0x0;
    pcVar17 = (args->m_value).m_string.ptr;
    (args->m_value).m_string.ptr = (char16_t *)0x0;
    qVar18 = (args->m_value).m_string.size;
    (args->m_value).m_string.size = 0;
    bVar19 = args->field_0x60 & 1;
    bVar20 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
             super_QArrayDataPointer<QXmlStreamAttribute>.size != 0;
    QArrayDataPointer<QXmlStreamAttribute>::detachAndGrow
              ((QArrayDataPointer<QXmlStreamAttribute> *)this,(uint)(i == 0 && bVar20),1,
               (QXmlStreamAttribute **)0x0,(QArrayDataPointer<QXmlStreamAttribute> *)0x0);
    pQVar6 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
             super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
    if (i != 0 || !bVar20) {
      pQVar1 = pQVar6 + i;
      memmove(pQVar1 + 1,pQVar6 + i,
              ((this->super_QGenericArrayOps<QXmlStreamAttribute>).
               super_QArrayDataPointer<QXmlStreamAttribute>.size - i) * 0x68);
      (pQVar1->m_name).m_string.d = pDVar7;
      (pQVar1->m_name).m_string.ptr = pcVar8;
      (pQVar1->m_name).m_string.size = qVar9;
      (pQVar1->m_namespaceUri).m_string.d = pDVar10;
      (pQVar1->m_namespaceUri).m_string.ptr = pcVar11;
      (pQVar1->m_namespaceUri).m_string.size = qVar12;
      (pQVar1->m_qualifiedName).m_string.d = pDVar13;
      (pQVar1->m_qualifiedName).m_string.ptr = pcVar14;
      (pQVar1->m_qualifiedName).m_string.size = qVar15;
      (pQVar1->m_value).m_string.d = pDVar16;
      (pQVar1->m_value).m_string.ptr = pcVar17;
      (pQVar1->m_value).m_string.size = qVar18;
      pQVar1->field_0x60 = pQVar1->field_0x60 & 0xfe | bVar19;
      goto LAB_0039e94d;
    }
    pQVar6[-1].m_name.m_string.d = pDVar7;
    pQVar6[-1].m_name.m_string.ptr = pcVar8;
    pQVar6[-1].m_name.m_string.size = qVar9;
    pQVar6[-1].m_namespaceUri.m_string.d = pDVar10;
    pQVar6[-1].m_namespaceUri.m_string.ptr = pcVar11;
    pQVar6[-1].m_namespaceUri.m_string.size = qVar12;
    pQVar6[-1].m_qualifiedName.m_string.d = pDVar13;
    pQVar6[-1].m_qualifiedName.m_string.ptr = pcVar14;
    pQVar6[-1].m_qualifiedName.m_string.size = qVar15;
    pQVar6[-1].m_value.m_string.d = pDVar16;
    pQVar6[-1].m_value.m_string.ptr = pcVar17;
    pQVar6[-1].m_value.m_string.size = qVar18;
    pQVar6[-1].field_0x60 = pQVar6[-1].field_0x60 & 0xfe | bVar19;
  }
  else {
    if (((this->super_QGenericArrayOps<QXmlStreamAttribute>).
         super_QArrayDataPointer<QXmlStreamAttribute>.size == i) &&
       (pQVar6 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
                 super_QArrayDataPointer<QXmlStreamAttribute>.ptr,
       (pDVar5->super_QArrayData).alloc - i !=
       ((long)((long)pQVar6 -
              ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x4ec4ec4ec4ec4ec5)) {
      pDVar7 = (args->m_name).m_string.d;
      (args->m_name).m_string.d = (Data *)0x0;
      pQVar6[i].m_name.m_string.d = pDVar7;
      pcVar8 = (args->m_name).m_string.ptr;
      (args->m_name).m_string.ptr = (char16_t *)0x0;
      pQVar6[i].m_name.m_string.ptr = pcVar8;
      qVar9 = (args->m_name).m_string.size;
      (args->m_name).m_string.size = 0;
      pQVar6[i].m_name.m_string.size = qVar9;
      pDVar7 = (args->m_namespaceUri).m_string.d;
      (args->m_namespaceUri).m_string.d = (Data *)0x0;
      pQVar6[i].m_namespaceUri.m_string.d = pDVar7;
      pcVar8 = (args->m_namespaceUri).m_string.ptr;
      (args->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
      pQVar6[i].m_namespaceUri.m_string.ptr = pcVar8;
      qVar9 = (args->m_namespaceUri).m_string.size;
      (args->m_namespaceUri).m_string.size = 0;
      pQVar6[i].m_namespaceUri.m_string.size = qVar9;
      pDVar7 = (args->m_qualifiedName).m_string.d;
      (args->m_qualifiedName).m_string.d = (Data *)0x0;
      pQVar6[i].m_qualifiedName.m_string.d = pDVar7;
      pcVar8 = (args->m_qualifiedName).m_string.ptr;
      (args->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
      pQVar6[i].m_qualifiedName.m_string.ptr = pcVar8;
      qVar9 = (args->m_qualifiedName).m_string.size;
      (args->m_qualifiedName).m_string.size = 0;
      pQVar6[i].m_qualifiedName.m_string.size = qVar9;
      pDVar7 = (args->m_value).m_string.d;
      (args->m_value).m_string.d = (Data *)0x0;
      pQVar6[i].m_value.m_string.d = pDVar7;
      pcVar8 = (args->m_value).m_string.ptr;
      (args->m_value).m_string.ptr = (char16_t *)0x0;
      pQVar6[i].m_value.m_string.ptr = pcVar8;
      qVar9 = (args->m_value).m_string.size;
      (args->m_value).m_string.size = 0;
      pQVar6[i].m_value.m_string.size = qVar9;
      pQVar6[i].field_0x60 = pQVar6[i].field_0x60 & 0xfe | args->field_0x60 & 1;
      goto LAB_0039e94d;
    }
    if ((i != 0) ||
       (pQVar6 = (this->super_QGenericArrayOps<QXmlStreamAttribute>).
                 super_QArrayDataPointer<QXmlStreamAttribute>.ptr,
       (QXmlStreamAttribute *)
       ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar6))
    goto LAB_0039e709;
    pDVar7 = (args->m_name).m_string.d;
    (args->m_name).m_string.d = (Data *)0x0;
    pQVar6[-1].m_name.m_string.d = pDVar7;
    pcVar8 = (args->m_name).m_string.ptr;
    (args->m_name).m_string.ptr = (char16_t *)0x0;
    pQVar6[-1].m_name.m_string.ptr = pcVar8;
    qVar9 = (args->m_name).m_string.size;
    (args->m_name).m_string.size = 0;
    pQVar6[-1].m_name.m_string.size = qVar9;
    pDVar7 = (args->m_namespaceUri).m_string.d;
    (args->m_namespaceUri).m_string.d = (Data *)0x0;
    pQVar6[-1].m_namespaceUri.m_string.d = pDVar7;
    pcVar8 = (args->m_namespaceUri).m_string.ptr;
    (args->m_namespaceUri).m_string.ptr = (char16_t *)0x0;
    pQVar6[-1].m_namespaceUri.m_string.ptr = pcVar8;
    qVar9 = (args->m_namespaceUri).m_string.size;
    (args->m_namespaceUri).m_string.size = 0;
    pQVar6[-1].m_namespaceUri.m_string.size = qVar9;
    pDVar7 = (args->m_qualifiedName).m_string.d;
    (args->m_qualifiedName).m_string.d = (Data *)0x0;
    pQVar6[-1].m_qualifiedName.m_string.d = pDVar7;
    pcVar8 = (args->m_qualifiedName).m_string.ptr;
    (args->m_qualifiedName).m_string.ptr = (char16_t *)0x0;
    pQVar6[-1].m_qualifiedName.m_string.ptr = pcVar8;
    qVar9 = (args->m_qualifiedName).m_string.size;
    (args->m_qualifiedName).m_string.size = 0;
    pQVar6[-1].m_qualifiedName.m_string.size = qVar9;
    pDVar7 = (args->m_value).m_string.d;
    (args->m_value).m_string.d = (Data *)0x0;
    pQVar6[-1].m_value.m_string.d = pDVar7;
    pcVar8 = (args->m_value).m_string.ptr;
    (args->m_value).m_string.ptr = (char16_t *)0x0;
    pQVar6[-1].m_value.m_string.ptr = pcVar8;
    qVar9 = (args->m_value).m_string.size;
    (args->m_value).m_string.size = 0;
    pQVar6[-1].m_value.m_string.size = qVar9;
    pQVar6[-1].field_0x60 = pQVar6[-1].field_0x60 & 0xfe | args->field_0x60 & 1;
  }
  ppQVar2 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
             super_QArrayDataPointer<QXmlStreamAttribute>.ptr;
  *ppQVar2 = *ppQVar2 + -1;
LAB_0039e94d:
  pqVar3 = &(this->super_QGenericArrayOps<QXmlStreamAttribute>).
            super_QArrayDataPointer<QXmlStreamAttribute>.size;
  *pqVar3 = *pqVar3 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar4) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }